

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O1

png_int_32 png_get_x_offset_microns(png_const_structrp png_ptr,png_const_inforp info_ptr)

{
  png_int_32 pVar1;
  
  pVar1 = 0;
  if (((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
      (pVar1 = 0, (info_ptr->valid & 0x100) != 0)) && (info_ptr->offset_unit_type == '\x01')) {
    pVar1 = info_ptr->x_offset;
  }
  return pVar1;
}

Assistant:

png_int_32 PNGAPI
png_get_x_offset_microns(png_const_structrp png_ptr, png_const_inforp info_ptr)
{
#ifdef PNG_oFFs_SUPPORTED
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_oFFs) != 0)
   {
      png_debug1(1, "in %s retrieval function", "png_get_x_offset_microns");

      if (info_ptr->offset_unit_type == PNG_OFFSET_MICROMETER)
         return (info_ptr->x_offset);
   }
#else
   PNG_UNUSED(png_ptr)
   PNG_UNUSED(info_ptr)
#endif

   return (0);
}